

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinHeap.h
# Opt level: O0

void __thiscall sznet::MinHeap<event>::checkHeap(MinHeap<event> *this)

{
  uint32_t uVar1;
  int iVar2;
  int r;
  uint32_t parent_index;
  uint32_t curIndex;
  uint32_t index;
  MinHeap<event> *this_local;
  
  parent_index = this->m_size;
  do {
    parent_index = parent_index - 1;
    if (parent_index == 0) {
      return;
    }
    r = parent_index;
    while( true ) {
      uVar1 = parent(this,r);
      iVar2 = (*this->m_pCmpFunc)(this->m_ptrArr[uVar1],this->m_ptrArr[(uint)r]);
      if (iVar2 == 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/test/ds/../../sznet/ds/MinHeap.h"
                      ,0xe9,"void sznet::MinHeap<event>::checkHeap() [T = event]");
      }
      if (uVar1 == 0) break;
      r = r + -1;
    }
  } while( true );
}

Assistant:

void checkHeap()
	{
		for (uint32_t index = (m_size - 1); index > 0; --index)
		{
			uint32_t curIndex = index;
			while (true)
			{
				// 当前节点下标的爸爸下标
				uint32_t parent_index = parent(curIndex);
				// 判断父亲节点是否比当前节点小
				auto r = m_pCmpFunc(m_ptrArr[parent_index], m_ptrArr[curIndex]);
				if (r == 1)
				{
					// 不要那就错了
					assert(0);
				}
				if (parent_index == 0)
				{
					break;
				}
				--curIndex;
			}
		}
	}